

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O1

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::beginRenderPassWithClearColor
          (DynamicStateBaseClass *this,VkClearColorValue *clearColor)

{
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_e8;
  RenderPassBeginInfo renderPassBegin;
  ImageSubresourceRange subresourceRange;
  VkMemoryBarrier memBarrier;
  CmdBufferBeginInfo beginInfo;
  
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  (*this->m_vk->_vptr_DeviceInterface[0x49])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &beginInfo);
  Draw::initialTransitionColor2DImage
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkImage)(((this->m_colorTargetImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             VK_IMAGE_LAYOUT_GENERAL);
  Draw::ImageSubresourceRange::ImageSubresourceRange(&subresourceRange,1,0,1,0,1);
  (*this->m_vk->_vptr_DeviceInterface[0x66])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (((this->m_colorTargetImage).m_ptr)->m_object).
             super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,clearColor,1,
             &subresourceRange);
  memBarrier.srcAccessMask = 0x1000;
  memBarrier.dstAccessMask = 0x180;
  memBarrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  memBarrier._4_4_ = 0;
  memBarrier.pNext._0_4_ = 0;
  memBarrier.pNext._4_4_ = 0;
  (*this->m_vk->_vptr_DeviceInterface[0x6d])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             0x1000,0x400,0,1,&memBarrier,0,0,0,0);
  local_e8.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            (&renderPassBegin,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkFramebuffer)
             (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal,(VkRect2D)(ZEXT816(0x8000000080) << 0x40),&local_e8);
  if (local_e8.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*this->m_vk->_vptr_DeviceInterface[0x74])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &renderPassBegin,0);
  if (renderPassBegin.m_clearValues.
      super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(renderPassBegin.m_clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)renderPassBegin.m_clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)renderPassBegin.m_clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DynamicStateBaseClass::beginRenderPassWithClearColor (const vk::VkClearColorValue& clearColor)
{
	const CmdBufferBeginInfo beginInfo;
	m_vk.beginCommandBuffer(*m_cmdBuffer, &beginInfo);

	initialTransitionColor2DImage(m_vk, *m_cmdBuffer, m_colorTargetImage->object(), vk::VK_IMAGE_LAYOUT_GENERAL);

	const ImageSubresourceRange subresourceRange(vk::VK_IMAGE_ASPECT_COLOR_BIT);
	m_vk.cmdClearColorImage(*m_cmdBuffer, m_colorTargetImage->object(),
		vk::VK_IMAGE_LAYOUT_GENERAL, &clearColor, 1, &subresourceRange);

	const vk::VkMemoryBarrier memBarrier =
	{
		vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT
	};

	m_vk.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT,
		vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,
		0, 1, &memBarrier, 0, DE_NULL, 0, DE_NULL);

	const vk::VkRect2D renderArea = { { 0, 0 }, { WIDTH, HEIGHT } };
	const RenderPassBeginInfo renderPassBegin(*m_renderPass, *m_framebuffer, renderArea);

	m_vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);
}